

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_8.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  longlong lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  char cVar26;
  int iVar27;
  int iVar28;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int32_t in_R9D;
  byte bVar29;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  undefined1 auVar30 [16];
  byte bVar46;
  ulong uVar39;
  undefined1 auVar47 [16];
  __m128i alVar48;
  int32_t in_stack_fffffffffffff898;
  long local_758;
  long local_750;
  ulong uStack_738;
  __m128i vH_1;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_8_t e;
  __m128i_8_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  char local_5e9;
  int8_t score;
  __m128i vZero;
  int8_t POS_LIMIT;
  int8_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int8_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_558;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  char local_268;
  char cStack_267;
  char cStack_266;
  char cStack_265;
  char cStack_264;
  char cStack_263;
  char cStack_262;
  char cStack_261;
  char cStack_260;
  char cStack_25f;
  char cStack_25e;
  char cStack_25d;
  char cStack_25c;
  char cStack_25b;
  char cStack_25a;
  char cStack_259;
  char local_248;
  char cStack_247;
  char cStack_246;
  char cStack_245;
  char cStack_244;
  char cStack_243;
  char cStack_242;
  char cStack_241;
  char cStack_240;
  char cStack_23f;
  char cStack_23e;
  char cStack_23d;
  char cStack_23c;
  char cStack_23b;
  char cStack_23a;
  char cStack_239;
  char local_238;
  char cStack_237;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  char cStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  char cStack_229;
  char local_228;
  char cStack_227;
  char cStack_226;
  char cStack_225;
  char cStack_224;
  char cStack_223;
  char cStack_222;
  char cStack_221;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char local_1f8;
  char cStack_1f7;
  char cStack_1f6;
  char cStack_1f5;
  char cStack_1f4;
  char cStack_1f3;
  char cStack_1f2;
  char cStack_1f1;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  char cStack_1d4;
  char cStack_1d3;
  char cStack_1d2;
  char cStack_1d1;
  char cStack_1d0;
  char cStack_1cf;
  char cStack_1ce;
  char cStack_1cd;
  char cStack_1cc;
  char cStack_1cb;
  char cStack_1ca;
  char cStack_1c9;
  char local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  char cStack_1b5;
  char cStack_1b4;
  char cStack_1b3;
  char cStack_1b2;
  char cStack_1b1;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char local_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char cStack_190;
  char cStack_18f;
  char cStack_18e;
  char cStack_18d;
  char cStack_18c;
  char cStack_18b;
  char cStack_18a;
  char cStack_189;
  char local_188;
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  char local_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  char cStack_170;
  char cStack_16f;
  char cStack_16e;
  char cStack_16d;
  char cStack_16c;
  char cStack_16b;
  char cStack_16a;
  char cStack_169;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  char local_148;
  char cStack_147;
  char cStack_146;
  char cStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  char cStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  char cStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  char cStack_139;
  char local_e8;
  char cStack_e7;
  char cStack_e6;
  char cStack_e5;
  char cStack_e4;
  char cStack_e3;
  char cStack_e2;
  char cStack_e1;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  char local_b8;
  char cStack_b7;
  char cStack_b6;
  char cStack_b5;
  char cStack_b4;
  char cStack_b3;
  char cStack_b2;
  char cStack_b1;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  undefined1 local_30 [24];
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse41_128_8","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile8).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse41_128_8",
            "profile->profile8.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse41_128_8",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_scan_profile_sse41_128_8",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_scan_profile_sse41_128_8","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_scan_profile_sse41_128_8","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_scan_profile_sse41_128_8","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_scan_profile_sse41_128_8","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_558 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    iVar27 = (iVar1 + 0xf) / 0x10;
    pvVar3 = (profile->profile8).score;
    i._0_1_ = (char)open;
    local_90._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    local_98._0_3_ = CONCAT21(CONCAT11((char)i,(char)i),(char)i);
    uVar4 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_98._0_3_)))));
    uVar7 = CONCAT17((char)i,CONCAT16((char)i,CONCAT15((char)i,CONCAT14((char)i,CONCAT13((char)i,
                                                  local_90._0_3_)))));
    j._0_1_ = (char)gap;
    local_70._0_3_ = CONCAT21(CONCAT11((char)j,(char)j),(char)j);
    local_78._0_3_ = CONCAT21(CONCAT11((char)j,(char)j),(char)j);
    uVar5 = CONCAT17((char)j,CONCAT16((char)j,CONCAT15((char)j,CONCAT14((char)j,CONCAT13((char)j,
                                                  local_78._0_3_)))));
    uVar8 = CONCAT17((char)j,CONCAT16((char)j,CONCAT15((char)j,CONCAT14((char)j,CONCAT13((char)j,
                                                  local_70._0_3_)))));
    if (ppVar2->min <= -open) {
      i._0_1_ = -(char)ppVar2->min;
    }
    bVar25 = (char)i + 0x81;
    cVar26 = ((byte)ppVar2->max ^ 0x7f) - 1;
    local_50._0_3_ = CONCAT21(CONCAT11(bVar25,bVar25),bVar25);
    local_58._0_3_ = CONCAT21(CONCAT11(bVar25,bVar25),bVar25);
    lVar6 = CONCAT17(bVar25,CONCAT16(bVar25,CONCAT15(bVar25,CONCAT14(bVar25,CONCAT13(bVar25,local_58
                                                  ._0_3_)))));
    lVar9 = CONCAT17(bVar25,CONCAT16(bVar25,CONCAT15(bVar25,CONCAT14(bVar25,CONCAT13(bVar25,local_50
                                                  ._0_3_)))));
    local_30._0_3_ = CONCAT21(CONCAT11(cVar26,cVar26),cVar26);
    local_38._0_3_ = CONCAT21(CONCAT11(cVar26,cVar26),cVar26);
    vSaturationCheckMax[1] =
         CONCAT17(cVar26,CONCAT16(cVar26,CONCAT15(cVar26,CONCAT14(cVar26,CONCAT13(cVar26,local_38.
                                                  _0_3_)))));
    vSaturationCheckMin[0] =
         CONCAT17(cVar26,CONCAT16(cVar26,CONCAT15(cVar26,CONCAT14(cVar26,CONCAT13(cVar26,local_30.
                                                  _0_3_)))));
    vSegLenXgap[1] = CONCAT71(0,bVar25);
    local_10[2] = -(char)iVar27 * (char)j;
    local_10[1] = local_10[2];
    local_10[0] = local_10[2];
    local_18[2] = local_10[2];
    local_18[1] = local_10[2];
    local_18[0] = local_10[2];
    auVar47[3] = local_10[2];
    auVar47._0_3_ = local_18._0_3_;
    auVar47[4] = local_10[2];
    auVar47[5] = local_10[2];
    auVar47[6] = local_10[2];
    auVar47[0xb] = local_10[2];
    auVar47._8_3_ = local_10._0_3_;
    auVar47[0xc] = local_10[2];
    auVar47[0xd] = local_10[2];
    auVar47[0xe] = local_10[2];
    auVar47[7] = local_10[2];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = vSegLenXgap[1];
    auVar47[0xf] = 0;
    _result = paddsb(auVar30,auVar47 << 8);
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar27 * 0x10,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x10100401;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      ptr = parasail_memalign___m128i(0x10,(long)iVar27);
      ptr_00 = parasail_memalign_int8_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar27);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar27);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar27);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int8_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar27; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 0x10; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            local_758 = (long)(-(gap * (h.m[1]._0_4_ * iVar27 + k)) - open);
            local_750 = local_758;
            if (local_758 < -0x80) {
              local_750 = -0x80;
            }
            e.v[(long)(int)h.m[1]._0_4_ + 8] = (int8_t)local_750;
            local_758 = local_758 - open;
            if (local_758 < -0x80) {
              local_758 = -0x80;
            }
            *(char *)((long)&tmp + (long)(int)h.m[1]._0_4_) = (char)local_758;
          }
          ptr_02[(int)h.m[1]._4_4_][0] = e.m[1];
          ptr_02[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = '\0';
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar28 = -(gap * (k + -1)) - open;
          if (iVar28 < -0x80) {
            iVar28 = -0x80;
          }
          ptr_00[k] = (int8_t)iVar28;
        }
        auVar23._8_8_ = uVar7;
        auVar23._0_8_ = uVar4;
        register0x00001200 = psubsb(ZEXT816(0),auVar23);
        k = iVar27;
        while (k = k + -1, -1 < k) {
          ptr_03[k][0] = vE[1];
          ptr_03[k][1] = vGapper[0];
          auVar22._8_8_ = uVar8;
          auVar22._0_8_ = uVar5;
          register0x00001200 = psubsb(stack0xfffffffffffff958,auVar22);
        }
        vNegInfFront[1] = lVar6;
        vSaturationCheckMax[0] = lVar9;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar39 = ptr_02[iVar27 + -1][0];
          vHp[0] = ptr_02[iVar27 + -1][1] << 8 | uVar39 >> 0x38;
          pvW = (__m128i *)(uVar39 << 8 | (ulong)(byte)ptr_00[s1Len]);
          iVar28 = ppVar2->mapper[(byte)s2[s1Len]];
          auVar21._8_8_ = lVar9;
          auVar21._0_8_ = lVar6;
          register0x00001200 = psubsb(auVar21,(undefined1  [16])*ptr_03);
          vF[0] = lVar9;
          vH[1] = lVar6;
          k = 0;
          while( true ) {
            local_188 = (char)vH[1];
            cStack_187 = vH[1]._1_1_;
            cStack_186 = vH[1]._2_1_;
            cStack_185 = vH[1]._3_1_;
            cStack_184 = vH[1]._4_1_;
            cStack_183 = vH[1]._5_1_;
            cStack_182 = vH[1]._6_1_;
            cStack_181 = vH[1]._7_1_;
            cStack_180 = (char)vH[2];
            cStack_17f = vH[2]._1_1_;
            cStack_17e = vH[2]._2_1_;
            cStack_17d = vH[2]._3_1_;
            cStack_17c = vH[2]._4_1_;
            cStack_17b = vH[2]._5_1_;
            cStack_17a = vH[2]._6_1_;
            cStack_179 = vH[2]._7_1_;
            if (iVar27 <= k) break;
            alVar48 = ptr_02[k];
            auVar20._8_8_ = uVar8;
            auVar20._0_8_ = uVar5;
            auVar47 = psubsb((undefined1  [16])ptr[k],auVar20);
            auVar19._8_8_ = uVar7;
            auVar19._0_8_ = uVar4;
            auVar30 = psubsb((undefined1  [16])ptr_02[k],auVar19);
            local_168 = auVar47[0];
            cStack_167 = auVar47[1];
            cStack_166 = auVar47[2];
            cStack_165 = auVar47[3];
            cStack_164 = auVar47[4];
            cStack_163 = auVar47[5];
            cStack_162 = auVar47[6];
            cStack_161 = auVar47[7];
            cStack_160 = auVar47[8];
            cStack_15f = auVar47[9];
            cStack_15e = auVar47[10];
            cStack_15d = auVar47[0xb];
            cStack_15c = auVar47[0xc];
            cStack_15b = auVar47[0xd];
            cStack_15a = auVar47[0xe];
            cStack_159 = auVar47[0xf];
            local_178 = auVar30[0];
            cStack_177 = auVar30[1];
            cStack_176 = auVar30[2];
            cStack_175 = auVar30[3];
            cStack_174 = auVar30[4];
            cStack_173 = auVar30[5];
            cStack_172 = auVar30[6];
            cStack_171 = auVar30[7];
            cStack_170 = auVar30[8];
            cStack_16f = auVar30[9];
            cStack_16e = auVar30[10];
            cStack_16d = auVar30[0xb];
            cStack_16c = auVar30[0xc];
            cStack_16b = auVar30[0xd];
            cStack_16a = auVar30[0xe];
            cStack_169 = auVar30[0xf];
            bVar29 = (local_168 < local_178) * local_178 | (local_168 >= local_178) * local_168;
            bVar31 = (cStack_167 < cStack_177) * cStack_177 |
                     (cStack_167 >= cStack_177) * cStack_167;
            bVar32 = (cStack_166 < cStack_176) * cStack_176 |
                     (cStack_166 >= cStack_176) * cStack_166;
            bVar33 = (cStack_165 < cStack_175) * cStack_175 |
                     (cStack_165 >= cStack_175) * cStack_165;
            bVar34 = (cStack_164 < cStack_174) * cStack_174 |
                     (cStack_164 >= cStack_174) * cStack_164;
            bVar35 = (cStack_163 < cStack_173) * cStack_173 |
                     (cStack_163 >= cStack_173) * cStack_163;
            bVar36 = (cStack_162 < cStack_172) * cStack_172 |
                     (cStack_162 >= cStack_172) * cStack_162;
            bVar37 = (cStack_161 < cStack_171) * cStack_171 |
                     (cStack_161 >= cStack_171) * cStack_161;
            bVar38 = (cStack_160 < cStack_170) * cStack_170 |
                     (cStack_160 >= cStack_170) * cStack_160;
            bVar40 = (cStack_15f < cStack_16f) * cStack_16f |
                     (cStack_15f >= cStack_16f) * cStack_15f;
            bVar41 = (cStack_15e < cStack_16e) * cStack_16e |
                     (cStack_15e >= cStack_16e) * cStack_15e;
            bVar42 = (cStack_15d < cStack_16d) * cStack_16d |
                     (cStack_15d >= cStack_16d) * cStack_15d;
            bVar43 = (cStack_15c < cStack_16c) * cStack_16c |
                     (cStack_15c >= cStack_16c) * cStack_15c;
            bVar44 = (cStack_15b < cStack_16b) * cStack_16b |
                     (cStack_15b >= cStack_16b) * cStack_15b;
            bVar45 = (cStack_15a < cStack_16a) * cStack_16a |
                     (cStack_15a >= cStack_16a) * cStack_15a;
            bVar46 = (cStack_159 < cStack_169) * cStack_169 |
                     (cStack_159 >= cStack_169) * cStack_159;
            vHt[1] = CONCAT17(bVar37,CONCAT16(bVar36,CONCAT15(bVar35,CONCAT14(bVar34,CONCAT13(bVar33
                                                  ,CONCAT12(bVar32,CONCAT11(bVar31,bVar29)))))));
            vE[0] = CONCAT17(bVar46,CONCAT16(bVar45,CONCAT15(bVar44,CONCAT14(bVar43,CONCAT13(bVar42,
                                                  CONCAT12(bVar41,CONCAT11(bVar40,bVar38)))))));
            auVar30 = paddsb((undefined1  [16])_pvW,
                             *(undefined1 (*) [16])
                              ((long)pvVar3 + (long)k * 0x10 + (long)(iVar28 * iVar27) * 0x10));
            auVar47 = paddsb(stack0xfffffffffffff938,(undefined1  [16])ptr_03[k]);
            local_198 = auVar47[0];
            cStack_197 = auVar47[1];
            cStack_196 = auVar47[2];
            cStack_195 = auVar47[3];
            cStack_194 = auVar47[4];
            cStack_193 = auVar47[5];
            cStack_192 = auVar47[6];
            cStack_191 = auVar47[7];
            cStack_190 = auVar47[8];
            cStack_18f = auVar47[9];
            cStack_18e = auVar47[10];
            cStack_18d = auVar47[0xb];
            cStack_18c = auVar47[0xc];
            cStack_18b = auVar47[0xd];
            cStack_18a = auVar47[0xe];
            cStack_189 = auVar47[0xf];
            vH[1]._0_2_ = CONCAT11((cStack_187 < cStack_197) * cStack_197 |
                                   (cStack_187 >= cStack_197) * cStack_187,
                                   (local_188 < local_198) * local_198 |
                                   (local_188 >= local_198) * local_188);
            vH[1]._0_3_ = CONCAT12((cStack_186 < cStack_196) * cStack_196 |
                                   (cStack_186 >= cStack_196) * cStack_186,(undefined2)vH[1]);
            vH[1]._0_4_ = CONCAT13((cStack_185 < cStack_195) * cStack_195 |
                                   (cStack_185 >= cStack_195) * cStack_185,(undefined3)vH[1]);
            vH[1]._0_5_ = CONCAT14((cStack_184 < cStack_194) * cStack_194 |
                                   (cStack_184 >= cStack_194) * cStack_184,(undefined4)vH[1]);
            vH[1]._0_6_ = CONCAT15((cStack_183 < cStack_193) * cStack_193 |
                                   (cStack_183 >= cStack_193) * cStack_183,(undefined5)vH[1]);
            vH[1]._0_7_ = CONCAT16((cStack_182 < cStack_192) * cStack_192 |
                                   (cStack_182 >= cStack_192) * cStack_182,(undefined6)vH[1]);
            vH[1] = CONCAT17((cStack_181 < cStack_191) * cStack_191 |
                             (cStack_181 >= cStack_191) * cStack_181,(undefined7)vH[1]);
            vF[0]._0_1_ = (cStack_180 < cStack_190) * cStack_190 |
                          (cStack_180 >= cStack_190) * cStack_180;
            vF[0]._1_1_ = (cStack_17f < cStack_18f) * cStack_18f |
                          (cStack_17f >= cStack_18f) * cStack_17f;
            vF[0]._2_1_ = (cStack_17e < cStack_18e) * cStack_18e |
                          (cStack_17e >= cStack_18e) * cStack_17e;
            vF[0]._3_1_ = (cStack_17d < cStack_18d) * cStack_18d |
                          (cStack_17d >= cStack_18d) * cStack_17d;
            vF[0]._4_1_ = (cStack_17c < cStack_18c) * cStack_18c |
                          (cStack_17c >= cStack_18c) * cStack_17c;
            vF[0]._5_1_ = (cStack_17b < cStack_18b) * cStack_18b |
                          (cStack_17b >= cStack_18b) * cStack_17b;
            vF[0]._6_1_ = (cStack_17a < cStack_18a) * cStack_18a |
                          (cStack_17a >= cStack_18a) * cStack_17a;
            vF[0]._7_1_ = (cStack_179 < cStack_189) * cStack_189 |
                          (cStack_179 >= cStack_189) * cStack_179;
            local_1b8 = auVar30[0];
            cStack_1b7 = auVar30[1];
            cStack_1b6 = auVar30[2];
            cStack_1b5 = auVar30[3];
            cStack_1b4 = auVar30[4];
            cStack_1b3 = auVar30[5];
            cStack_1b2 = auVar30[6];
            cStack_1b1 = auVar30[7];
            cStack_1b0 = auVar30[8];
            cStack_1af = auVar30[9];
            cStack_1ae = auVar30[10];
            cStack_1ad = auVar30[0xb];
            cStack_1ac = auVar30[0xc];
            cStack_1ab = auVar30[0xd];
            cStack_1aa = auVar30[0xe];
            cStack_1a9 = auVar30[0xf];
            vF[1] = CONCAT17(((char)bVar37 < cStack_1b1) * cStack_1b1 |
                             ((char)bVar37 >= cStack_1b1) * bVar37,
                             CONCAT16(((char)bVar36 < cStack_1b2) * cStack_1b2 |
                                      ((char)bVar36 >= cStack_1b2) * bVar36,
                                      CONCAT15(((char)bVar35 < cStack_1b3) * cStack_1b3 |
                                               ((char)bVar35 >= cStack_1b3) * bVar35,
                                               CONCAT14(((char)bVar34 < cStack_1b4) * cStack_1b4 |
                                                        ((char)bVar34 >= cStack_1b4) * bVar34,
                                                        CONCAT13(((char)bVar33 < cStack_1b5) *
                                                                 cStack_1b5 |
                                                                 ((char)bVar33 >= cStack_1b5) *
                                                                 bVar33,CONCAT12(((char)bVar32 <
                                                                                 cStack_1b6) *
                                                                                 cStack_1b6 |
                                                                                 ((char)bVar32 >=
                                                                                 cStack_1b6) *
                                                                                 bVar32,CONCAT11(((
                                                  char)bVar31 < cStack_1b7) * cStack_1b7 |
                                                  ((char)bVar31 >= cStack_1b7) * bVar31,
                                                  ((char)bVar29 < local_1b8) * local_1b8 |
                                                  ((char)bVar29 >= local_1b8) * bVar29)))))));
            vHt[0]._0_1_ = ((char)bVar38 < cStack_1b0) * cStack_1b0 |
                           ((char)bVar38 >= cStack_1b0) * bVar38;
            vHt[0]._1_1_ = ((char)bVar40 < cStack_1af) * cStack_1af |
                           ((char)bVar40 >= cStack_1af) * bVar40;
            vHt[0]._2_1_ = ((char)bVar41 < cStack_1ae) * cStack_1ae |
                           ((char)bVar41 >= cStack_1ae) * bVar41;
            vHt[0]._3_1_ = ((char)bVar42 < cStack_1ad) * cStack_1ad |
                           ((char)bVar42 >= cStack_1ad) * bVar42;
            vHt[0]._4_1_ = ((char)bVar43 < cStack_1ac) * cStack_1ac |
                           ((char)bVar43 >= cStack_1ac) * bVar43;
            vHt[0]._5_1_ = ((char)bVar44 < cStack_1ab) * cStack_1ab |
                           ((char)bVar44 >= cStack_1ab) * bVar44;
            vHt[0]._6_1_ = ((char)bVar45 < cStack_1aa) * cStack_1aa |
                           ((char)bVar45 >= cStack_1aa) * bVar45;
            vHt[0]._7_1_ = ((char)bVar46 < cStack_1a9) * cStack_1a9 |
                           ((char)bVar46 >= cStack_1a9) * bVar46;
            ptr[k][0] = vHt[1];
            ptr[k][1] = vE[0];
            ptr_01[k][0] = vF[1];
            ptr_01[k][1] = vHt[0];
            k = k + 1;
            _pvW = alVar48;
          }
          bVar29 = ptr_00[(long)s1Len + 1];
          auVar15._8_8_ = vHt[0] << 8 | (ulong)vF[1] >> 0x38;
          auVar15._0_8_ = vF[1] << 8 | (ulong)bVar29;
          auVar30 = paddsb(auVar15,(undefined1  [16])*ptr_03);
          local_1d8 = auVar30[0];
          cStack_1d7 = auVar30[1];
          cStack_1d6 = auVar30[2];
          cStack_1d5 = auVar30[3];
          cStack_1d4 = auVar30[4];
          cStack_1d3 = auVar30[5];
          cStack_1d2 = auVar30[6];
          cStack_1d1 = auVar30[7];
          cStack_1d0 = auVar30[8];
          cStack_1cf = auVar30[9];
          cStack_1ce = auVar30[10];
          cStack_1cd = auVar30[0xb];
          cStack_1cc = auVar30[0xc];
          cStack_1cb = auVar30[0xd];
          cStack_1ca = auVar30[0xe];
          cStack_1c9 = auVar30[0xf];
          vH[1]._0_2_ = CONCAT11((cStack_187 < cStack_1d7) * cStack_1d7 |
                                 (cStack_187 >= cStack_1d7) * cStack_187,
                                 (local_188 < local_1d8) * local_1d8 |
                                 (local_188 >= local_1d8) * local_188);
          vH[1]._0_3_ = CONCAT12((cStack_186 < cStack_1d6) * cStack_1d6 |
                                 (cStack_186 >= cStack_1d6) * cStack_186,(undefined2)vH[1]);
          vH[1]._0_4_ = CONCAT13((cStack_185 < cStack_1d5) * cStack_1d5 |
                                 (cStack_185 >= cStack_1d5) * cStack_185,(undefined3)vH[1]);
          vH[1]._0_5_ = CONCAT14((cStack_184 < cStack_1d4) * cStack_1d4 |
                                 (cStack_184 >= cStack_1d4) * cStack_184,(undefined4)vH[1]);
          vH[1]._0_6_ = CONCAT15((cStack_183 < cStack_1d3) * cStack_1d3 |
                                 (cStack_183 >= cStack_1d3) * cStack_183,(undefined5)vH[1]);
          vH[1]._0_7_ = CONCAT16((cStack_182 < cStack_1d2) * cStack_1d2 |
                                 (cStack_182 >= cStack_1d2) * cStack_182,(undefined6)vH[1]);
          vH[1] = CONCAT17((cStack_181 < cStack_1d1) * cStack_1d1 |
                           (cStack_181 >= cStack_1d1) * cStack_181,(undefined7)vH[1]);
          vF[0]._0_1_ = (cStack_180 < cStack_1d0) * cStack_1d0 |
                        (cStack_180 >= cStack_1d0) * cStack_180;
          vF[0]._1_1_ = (cStack_17f < cStack_1cf) * cStack_1cf |
                        (cStack_17f >= cStack_1cf) * cStack_17f;
          vF[0]._2_1_ = (cStack_17e < cStack_1ce) * cStack_1ce |
                        (cStack_17e >= cStack_1ce) * cStack_17e;
          vF[0]._3_1_ = (cStack_17d < cStack_1cd) * cStack_1cd |
                        (cStack_17d >= cStack_1cd) * cStack_17d;
          vF[0]._4_1_ = (cStack_17c < cStack_1cc) * cStack_1cc |
                        (cStack_17c >= cStack_1cc) * cStack_17c;
          vF[0]._5_1_ = (cStack_17b < cStack_1cb) * cStack_1cb |
                        (cStack_17b >= cStack_1cb) * cStack_17b;
          vF[0]._6_1_ = (cStack_17a < cStack_1ca) * cStack_1ca |
                        (cStack_17a >= cStack_1ca) * cStack_17a;
          vF[0]._7_1_ = (cStack_179 < cStack_1c9) * cStack_1c9 |
                        (cStack_179 >= cStack_1c9) * cStack_179;
          k = 0;
          while( true ) {
            if (0xd < k) break;
            auVar14._8_8_ = vF[0] << 8 | (ulong)vH[1] >> 0x38;
            auVar14._0_8_ = vH[1] << 8;
            auVar30 = paddsb(auVar14,_result);
            local_1e8 = (char)vH[1];
            cStack_1e7 = vH[1]._1_1_;
            cStack_1e6 = vH[1]._2_1_;
            cStack_1e5 = vH[1]._3_1_;
            cStack_1e4 = vH[1]._4_1_;
            cStack_1e3 = vH[1]._5_1_;
            cStack_1e2 = vH[1]._6_1_;
            cStack_1e1 = vH[1]._7_1_;
            cStack_1e0 = (char)vH[2];
            cStack_1df = vH[2]._1_1_;
            cStack_1de = vH[2]._2_1_;
            cStack_1dd = vH[2]._3_1_;
            cStack_1dc = vH[2]._4_1_;
            cStack_1db = vH[2]._5_1_;
            cStack_1da = vH[2]._6_1_;
            cStack_1d9 = vH[2]._7_1_;
            local_1f8 = auVar30[0];
            cStack_1f7 = auVar30[1];
            cStack_1f6 = auVar30[2];
            cStack_1f5 = auVar30[3];
            cStack_1f4 = auVar30[4];
            cStack_1f3 = auVar30[5];
            cStack_1f2 = auVar30[6];
            cStack_1f1 = auVar30[7];
            cStack_1f0 = auVar30[8];
            cStack_1ef = auVar30[9];
            cStack_1ee = auVar30[10];
            cStack_1ed = auVar30[0xb];
            cStack_1ec = auVar30[0xc];
            cStack_1eb = auVar30[0xd];
            cStack_1ea = auVar30[0xe];
            cStack_1e9 = auVar30[0xf];
            vH[1]._0_2_ = CONCAT11((cStack_1e7 < cStack_1f7) * cStack_1f7 |
                                   (cStack_1e7 >= cStack_1f7) * cStack_1e7,
                                   (local_1e8 < local_1f8) * local_1f8 |
                                   (local_1e8 >= local_1f8) * local_1e8);
            vH[1]._0_3_ = CONCAT12((cStack_1e6 < cStack_1f6) * cStack_1f6 |
                                   (cStack_1e6 >= cStack_1f6) * cStack_1e6,(undefined2)vH[1]);
            vH[1]._0_4_ = CONCAT13((cStack_1e5 < cStack_1f5) * cStack_1f5 |
                                   (cStack_1e5 >= cStack_1f5) * cStack_1e5,(undefined3)vH[1]);
            vH[1]._0_5_ = CONCAT14((cStack_1e4 < cStack_1f4) * cStack_1f4 |
                                   (cStack_1e4 >= cStack_1f4) * cStack_1e4,(undefined4)vH[1]);
            vH[1]._0_6_ = CONCAT15((cStack_1e3 < cStack_1f3) * cStack_1f3 |
                                   (cStack_1e3 >= cStack_1f3) * cStack_1e3,(undefined5)vH[1]);
            vH[1]._0_7_ = CONCAT16((cStack_1e2 < cStack_1f2) * cStack_1f2 |
                                   (cStack_1e2 >= cStack_1f2) * cStack_1e2,(undefined6)vH[1]);
            vH[1] = CONCAT17((cStack_1e1 < cStack_1f1) * cStack_1f1 |
                             (cStack_1e1 >= cStack_1f1) * cStack_1e1,(undefined7)vH[1]);
            vF[0]._0_1_ = (cStack_1e0 < cStack_1f0) * cStack_1f0 |
                          (cStack_1e0 >= cStack_1f0) * cStack_1e0;
            vF[0]._1_1_ = (cStack_1df < cStack_1ef) * cStack_1ef |
                          (cStack_1df >= cStack_1ef) * cStack_1df;
            vF[0]._2_1_ = (cStack_1de < cStack_1ee) * cStack_1ee |
                          (cStack_1de >= cStack_1ee) * cStack_1de;
            vF[0]._3_1_ = (cStack_1dd < cStack_1ed) * cStack_1ed |
                          (cStack_1dd >= cStack_1ed) * cStack_1dd;
            vF[0]._4_1_ = (cStack_1dc < cStack_1ec) * cStack_1ec |
                          (cStack_1dc >= cStack_1ec) * cStack_1dc;
            vF[0]._5_1_ = (cStack_1db < cStack_1eb) * cStack_1eb |
                          (cStack_1db >= cStack_1eb) * cStack_1db;
            vF[0]._6_1_ = (cStack_1da < cStack_1ea) * cStack_1ea |
                          (cStack_1da >= cStack_1ea) * cStack_1da;
            vF[0]._7_1_ = (cStack_1d9 < cStack_1e9) * cStack_1e9 |
                          (cStack_1d9 >= cStack_1e9) * cStack_1d9;
            k = k + 1;
          }
          auVar13._8_8_ = vF[0] << 8 | (ulong)vH[1] >> 0x38;
          auVar13._0_8_ = vH[1] << 8;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsb(auVar13,auVar12);
          cStack_207 = (char)vF[1];
          cStack_206 = vF[1]._1_1_;
          cStack_205 = vF[1]._2_1_;
          cStack_204 = vF[1]._3_1_;
          cStack_203 = vF[1]._4_1_;
          cStack_202 = vF[1]._5_1_;
          cStack_201 = vF[1]._6_1_;
          cStack_200 = vF[1]._7_1_;
          cStack_1ff = (char)vF[2];
          cStack_1fe = vF[2]._1_1_;
          cStack_1fd = vF[2]._2_1_;
          cStack_1fc = vF[2]._3_1_;
          cStack_1fb = vF[2]._4_1_;
          cStack_1fa = vF[2]._5_1_;
          cStack_1f9 = vF[2]._6_1_;
          local_218 = (char)vH[1];
          cStack_217 = vH[1]._1_1_;
          cStack_216 = vH[1]._2_1_;
          cStack_215 = vH[1]._3_1_;
          cStack_214 = vH[1]._4_1_;
          cStack_213 = vH[1]._5_1_;
          cStack_212 = vH[1]._6_1_;
          cStack_211 = vH[1]._7_1_;
          cStack_210 = (char)vH[2];
          cStack_20f = vH[2]._1_1_;
          cStack_20e = vH[2]._2_1_;
          cStack_20d = vH[2]._3_1_;
          cStack_20c = vH[2]._4_1_;
          cStack_20b = vH[2]._5_1_;
          cStack_20a = vH[2]._6_1_;
          cStack_209 = vH[2]._7_1_;
          vHp[1]._0_2_ = CONCAT11((cStack_207 < cStack_217) * cStack_217 |
                                  (cStack_207 >= cStack_217) * cStack_207,
                                  ((char)bVar29 < local_218) * local_218 |
                                  ((char)bVar29 >= local_218) * bVar29);
          vHp[1]._0_3_ = CONCAT12((cStack_206 < cStack_216) * cStack_216 |
                                  (cStack_206 >= cStack_216) * cStack_206,(undefined2)vHp[1]);
          vHp[1]._0_4_ = CONCAT13((cStack_205 < cStack_215) * cStack_215 |
                                  (cStack_205 >= cStack_215) * cStack_205,(undefined3)vHp[1]);
          vHp[1]._0_5_ = CONCAT14((cStack_204 < cStack_214) * cStack_214 |
                                  (cStack_204 >= cStack_214) * cStack_204,(undefined4)vHp[1]);
          vHp[1]._0_6_ = CONCAT15((cStack_203 < cStack_213) * cStack_213 |
                                  (cStack_203 >= cStack_213) * cStack_203,(undefined5)vHp[1]);
          vHp[1]._0_7_ = CONCAT16((cStack_202 < cStack_212) * cStack_212 |
                                  (cStack_202 >= cStack_212) * cStack_202,(undefined6)vHp[1]);
          vHp[1] = CONCAT17((cStack_201 < cStack_211) * cStack_211 |
                            (cStack_201 >= cStack_211) * cStack_201,(undefined7)vHp[1]);
          vH[0]._0_2_ = CONCAT11((cStack_1ff < cStack_20f) * cStack_20f |
                                 (cStack_1ff >= cStack_20f) * cStack_1ff,
                                 (cStack_200 < cStack_210) * cStack_210 |
                                 (cStack_200 >= cStack_210) * cStack_200);
          vH[0]._0_3_ = CONCAT12((cStack_1fe < cStack_20e) * cStack_20e |
                                 (cStack_1fe >= cStack_20e) * cStack_1fe,(undefined2)vH[0]);
          vH[0]._0_4_ = CONCAT13((cStack_1fd < cStack_20d) * cStack_20d |
                                 (cStack_1fd >= cStack_20d) * cStack_1fd,(undefined3)vH[0]);
          vH[0]._0_5_ = CONCAT14((cStack_1fc < cStack_20c) * cStack_20c |
                                 (cStack_1fc >= cStack_20c) * cStack_1fc,(undefined4)vH[0]);
          vH[0]._0_6_ = CONCAT15((cStack_1fb < cStack_20b) * cStack_20b |
                                 (cStack_1fb >= cStack_20b) * cStack_1fb,(undefined5)vH[0]);
          vH[0]._0_7_ = CONCAT16((cStack_1fa < cStack_20a) * cStack_20a |
                                 (cStack_1fa >= cStack_20a) * cStack_1fa,(undefined6)vH[0]);
          vH[0] = CONCAT17((cStack_1f9 < cStack_209) * cStack_209 |
                           (cStack_1f9 >= cStack_209) * cStack_1f9,(undefined7)vH[0]);
          for (k = 0; k < iVar27; k = k + 1) {
            lVar10 = ptr_01[k][0];
            lVar11 = ptr_01[k][1];
            auVar18._8_8_ = uVar8;
            auVar18._0_8_ = uVar5;
            auVar47 = psubsb(stack0xfffffffffffff928,auVar18);
            auVar17._8_8_ = vH[0];
            auVar17._0_8_ = vHp[1];
            auVar16._8_8_ = uVar7;
            auVar16._0_8_ = uVar4;
            auVar30 = psubsb(auVar17,auVar16);
            local_228 = auVar47[0];
            cStack_227 = auVar47[1];
            cStack_226 = auVar47[2];
            cStack_225 = auVar47[3];
            cStack_224 = auVar47[4];
            cStack_223 = auVar47[5];
            cStack_222 = auVar47[6];
            cStack_221 = auVar47[7];
            cStack_220 = auVar47[8];
            cStack_21f = auVar47[9];
            cStack_21e = auVar47[10];
            cStack_21d = auVar47[0xb];
            cStack_21c = auVar47[0xc];
            cStack_21b = auVar47[0xd];
            cStack_21a = auVar47[0xe];
            cStack_219 = auVar47[0xf];
            local_238 = auVar30[0];
            cStack_237 = auVar30[1];
            cStack_236 = auVar30[2];
            cStack_235 = auVar30[3];
            cStack_234 = auVar30[4];
            cStack_233 = auVar30[5];
            cStack_232 = auVar30[6];
            cStack_231 = auVar30[7];
            cStack_230 = auVar30[8];
            cStack_22f = auVar30[9];
            cStack_22e = auVar30[10];
            cStack_22d = auVar30[0xb];
            cStack_22c = auVar30[0xc];
            cStack_22b = auVar30[0xd];
            cStack_22a = auVar30[0xe];
            cStack_229 = auVar30[0xf];
            bVar29 = (local_228 < local_238) * local_238 | (local_228 >= local_238) * local_228;
            bVar31 = (cStack_227 < cStack_237) * cStack_237 |
                     (cStack_227 >= cStack_237) * cStack_227;
            bVar32 = (cStack_226 < cStack_236) * cStack_236 |
                     (cStack_226 >= cStack_236) * cStack_226;
            bVar33 = (cStack_225 < cStack_235) * cStack_235 |
                     (cStack_225 >= cStack_235) * cStack_225;
            bVar34 = (cStack_224 < cStack_234) * cStack_234 |
                     (cStack_224 >= cStack_234) * cStack_224;
            bVar35 = (cStack_223 < cStack_233) * cStack_233 |
                     (cStack_223 >= cStack_233) * cStack_223;
            bVar36 = (cStack_222 < cStack_232) * cStack_232 |
                     (cStack_222 >= cStack_232) * cStack_222;
            bVar37 = (cStack_221 < cStack_231) * cStack_231 |
                     (cStack_221 >= cStack_231) * cStack_221;
            vF[0]._0_1_ = (cStack_220 < cStack_230) * cStack_230 |
                          (cStack_220 >= cStack_230) * cStack_220;
            vF[0]._1_1_ = (cStack_21f < cStack_22f) * cStack_22f |
                          (cStack_21f >= cStack_22f) * cStack_21f;
            vF[0]._2_1_ = (cStack_21e < cStack_22e) * cStack_22e |
                          (cStack_21e >= cStack_22e) * cStack_21e;
            vF[0]._3_1_ = (cStack_21d < cStack_22d) * cStack_22d |
                          (cStack_21d >= cStack_22d) * cStack_21d;
            vF[0]._4_1_ = (cStack_21c < cStack_22c) * cStack_22c |
                          (cStack_21c >= cStack_22c) * cStack_21c;
            vF[0]._5_1_ = (cStack_21b < cStack_22b) * cStack_22b |
                          (cStack_21b >= cStack_22b) * cStack_21b;
            vF[0]._6_1_ = (cStack_21a < cStack_22a) * cStack_22a |
                          (cStack_21a >= cStack_22a) * cStack_21a;
            vF[0]._7_1_ = (cStack_219 < cStack_229) * cStack_229 |
                          (cStack_219 >= cStack_229) * cStack_219;
            vH[1]._0_2_ = CONCAT11(bVar31,bVar29);
            vH[1]._0_3_ = CONCAT12(bVar32,(undefined2)vH[1]);
            vH[1]._0_4_ = CONCAT13(bVar33,(undefined3)vH[1]);
            vH[1]._0_5_ = CONCAT14(bVar34,(undefined4)vH[1]);
            vH[1]._0_6_ = CONCAT15(bVar35,(undefined5)vH[1]);
            vH[1]._0_7_ = CONCAT16(bVar36,(undefined6)vH[1]);
            vH[1] = CONCAT17(bVar37,(undefined7)vH[1]);
            local_248 = (char)lVar10;
            cStack_247 = (char)((ulong)lVar10 >> 8);
            cStack_246 = (char)((ulong)lVar10 >> 0x10);
            cStack_245 = (char)((ulong)lVar10 >> 0x18);
            cStack_244 = (char)((ulong)lVar10 >> 0x20);
            cStack_243 = (char)((ulong)lVar10 >> 0x28);
            cStack_242 = (char)((ulong)lVar10 >> 0x30);
            cStack_241 = (char)((ulong)lVar10 >> 0x38);
            cStack_240 = (char)lVar11;
            cStack_23f = (char)((ulong)lVar11 >> 8);
            cStack_23e = (char)((ulong)lVar11 >> 0x10);
            cStack_23d = (char)((ulong)lVar11 >> 0x18);
            cStack_23c = (char)((ulong)lVar11 >> 0x20);
            cStack_23b = (char)((ulong)lVar11 >> 0x28);
            cStack_23a = (char)((ulong)lVar11 >> 0x30);
            cStack_239 = (char)((ulong)lVar11 >> 0x38);
            bVar29 = (local_248 < (char)bVar29) * bVar29 | (local_248 >= (char)bVar29) * local_248;
            bVar31 = (cStack_247 < (char)bVar31) * bVar31 |
                     (cStack_247 >= (char)bVar31) * cStack_247;
            bVar32 = (cStack_246 < (char)bVar32) * bVar32 |
                     (cStack_246 >= (char)bVar32) * cStack_246;
            bVar33 = (cStack_245 < (char)bVar33) * bVar33 |
                     (cStack_245 >= (char)bVar33) * cStack_245;
            bVar34 = (cStack_244 < (char)bVar34) * bVar34 |
                     (cStack_244 >= (char)bVar34) * cStack_244;
            bVar35 = (cStack_243 < (char)bVar35) * bVar35 |
                     (cStack_243 >= (char)bVar35) * cStack_243;
            bVar36 = (cStack_242 < (char)bVar36) * bVar36 |
                     (cStack_242 >= (char)bVar36) * cStack_242;
            bVar37 = (cStack_241 < (char)bVar37) * bVar37 |
                     (cStack_241 >= (char)bVar37) * cStack_241;
            bVar38 = (cStack_240 < (char)(byte)vF[0]) * (byte)vF[0] |
                     (cStack_240 >= (char)(byte)vF[0]) * cStack_240;
            bVar40 = (cStack_23f < (char)vF[0]._1_1_) * vF[0]._1_1_ |
                     (cStack_23f >= (char)vF[0]._1_1_) * cStack_23f;
            bVar41 = (cStack_23e < (char)vF[0]._2_1_) * vF[0]._2_1_ |
                     (cStack_23e >= (char)vF[0]._2_1_) * cStack_23e;
            bVar42 = (cStack_23d < (char)vF[0]._3_1_) * vF[0]._3_1_ |
                     (cStack_23d >= (char)vF[0]._3_1_) * cStack_23d;
            bVar43 = (cStack_23c < (char)vF[0]._4_1_) * vF[0]._4_1_ |
                     (cStack_23c >= (char)vF[0]._4_1_) * cStack_23c;
            bVar44 = (cStack_23b < (char)vF[0]._5_1_) * vF[0]._5_1_ |
                     (cStack_23b >= (char)vF[0]._5_1_) * cStack_23b;
            bVar45 = (cStack_23a < (char)vF[0]._6_1_) * vF[0]._6_1_ |
                     (cStack_23a >= (char)vF[0]._6_1_) * cStack_23a;
            bVar46 = (cStack_239 < (char)vF[0]._7_1_) * vF[0]._7_1_ |
                     (cStack_239 >= (char)vF[0]._7_1_) * cStack_239;
            vHp[1]._0_2_ = CONCAT11(bVar31,bVar29);
            vHp[1]._0_3_ = CONCAT12(bVar32,(undefined2)vHp[1]);
            vHp[1]._0_4_ = CONCAT13(bVar33,(undefined3)vHp[1]);
            vHp[1]._0_5_ = CONCAT14(bVar34,(undefined4)vHp[1]);
            vHp[1]._0_6_ = CONCAT15(bVar35,(undefined5)vHp[1]);
            vHp[1]._0_7_ = CONCAT16(bVar36,(undefined6)vHp[1]);
            vHp[1] = CONCAT17(bVar37,(undefined7)vHp[1]);
            vH[0]._0_2_ = CONCAT11(bVar40,bVar38);
            vH[0]._0_3_ = CONCAT12(bVar41,(undefined2)vH[0]);
            vH[0]._0_4_ = CONCAT13(bVar42,(undefined3)vH[0]);
            vH[0]._0_5_ = CONCAT14(bVar43,(undefined4)vH[0]);
            vH[0]._0_6_ = CONCAT15(bVar44,(undefined5)vH[0]);
            vH[0]._0_7_ = CONCAT16(bVar45,(undefined6)vH[0]);
            vH[0] = CONCAT17(bVar46,(undefined7)vH[0]);
            ptr_02[k][0] = vHp[1];
            ptr_02[k][1] = vH[0];
            local_148 = (char)vSaturationCheckMax[1];
            cStack_147 = (char)((ulong)vSaturationCheckMax[1] >> 8);
            cStack_146 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
            cStack_145 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
            cStack_144 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
            cStack_143 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
            cStack_142 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
            cStack_141 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
            cStack_140 = (char)vSaturationCheckMin[0];
            cStack_13f = (char)((ulong)vSaturationCheckMin[0] >> 8);
            cStack_13e = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
            cStack_13d = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
            cStack_13c = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
            cStack_13b = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
            cStack_13a = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
            cStack_139 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
            vSaturationCheckMax[1] =
                 CONCAT17(((char)bVar37 < cStack_141) * bVar37 |
                          ((char)bVar37 >= cStack_141) * cStack_141,
                          CONCAT16(((char)bVar36 < cStack_142) * bVar36 |
                                   ((char)bVar36 >= cStack_142) * cStack_142,
                                   CONCAT15(((char)bVar35 < cStack_143) * bVar35 |
                                            ((char)bVar35 >= cStack_143) * cStack_143,
                                            CONCAT14(((char)bVar34 < cStack_144) * bVar34 |
                                                     ((char)bVar34 >= cStack_144) * cStack_144,
                                                     CONCAT13(((char)bVar33 < cStack_145) * bVar33 |
                                                              ((char)bVar33 >= cStack_145) *
                                                              cStack_145,
                                                              CONCAT12(((char)bVar32 < cStack_146) *
                                                                       bVar32 | ((char)bVar32 >=
                                                                                cStack_146) *
                                                                                cStack_146,
                                                                       CONCAT11(((char)bVar31 <
                                                                                cStack_147) * bVar31
                                                                                | ((char)bVar31 >=
                                                                                  cStack_147) *
                                                                                  cStack_147,
                                                                                ((char)bVar29 <
                                                                                local_148) * bVar29
                                                                                | ((char)bVar29 >=
                                                                                  local_148) *
                                                                                  local_148)))))));
            vSaturationCheckMin[0] =
                 CONCAT17(((char)bVar46 < cStack_139) * bVar46 |
                          ((char)bVar46 >= cStack_139) * cStack_139,
                          CONCAT16(((char)bVar45 < cStack_13a) * bVar45 |
                                   ((char)bVar45 >= cStack_13a) * cStack_13a,
                                   CONCAT15(((char)bVar44 < cStack_13b) * bVar44 |
                                            ((char)bVar44 >= cStack_13b) * cStack_13b,
                                            CONCAT14(((char)bVar43 < cStack_13c) * bVar43 |
                                                     ((char)bVar43 >= cStack_13c) * cStack_13c,
                                                     CONCAT13(((char)bVar42 < cStack_13d) * bVar42 |
                                                              ((char)bVar42 >= cStack_13d) *
                                                              cStack_13d,
                                                              CONCAT12(((char)bVar41 < cStack_13e) *
                                                                       bVar41 | ((char)bVar41 >=
                                                                                cStack_13e) *
                                                                                cStack_13e,
                                                                       CONCAT11(((char)bVar40 <
                                                                                cStack_13f) * bVar40
                                                                                | ((char)bVar40 >=
                                                                                  cStack_13f) *
                                                                                  cStack_13f,
                                                                                ((char)bVar38 <
                                                                                cStack_140) * bVar38
                                                                                | ((char)bVar38 >=
                                                                                  cStack_140) *
                                                                                  cStack_140)))))));
            local_268 = (char)vNegInfFront[1];
            cStack_267 = (char)((ulong)vNegInfFront[1] >> 8);
            cStack_266 = (char)((ulong)vNegInfFront[1] >> 0x10);
            cStack_265 = (char)((ulong)vNegInfFront[1] >> 0x18);
            cStack_264 = (char)((ulong)vNegInfFront[1] >> 0x20);
            cStack_263 = (char)((ulong)vNegInfFront[1] >> 0x28);
            cStack_262 = (char)((ulong)vNegInfFront[1] >> 0x30);
            cStack_261 = (char)((ulong)vNegInfFront[1] >> 0x38);
            cStack_260 = (char)vSaturationCheckMax[0];
            cStack_25f = (char)((ulong)vSaturationCheckMax[0] >> 8);
            cStack_25e = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
            cStack_25d = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
            cStack_25c = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
            cStack_25b = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
            cStack_25a = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
            cStack_259 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
            vNegInfFront[1] =
                 CONCAT17((cStack_261 < (char)bVar37) * bVar37 |
                          (cStack_261 >= (char)bVar37) * cStack_261,
                          CONCAT16((cStack_262 < (char)bVar36) * bVar36 |
                                   (cStack_262 >= (char)bVar36) * cStack_262,
                                   CONCAT15((cStack_263 < (char)bVar35) * bVar35 |
                                            (cStack_263 >= (char)bVar35) * cStack_263,
                                            CONCAT14((cStack_264 < (char)bVar34) * bVar34 |
                                                     (cStack_264 >= (char)bVar34) * cStack_264,
                                                     CONCAT13((cStack_265 < (char)bVar33) * bVar33 |
                                                              (cStack_265 >= (char)bVar33) *
                                                              cStack_265,
                                                              CONCAT12((cStack_266 < (char)bVar32) *
                                                                       bVar32 | (cStack_266 >=
                                                                                (char)bVar32) *
                                                                                cStack_266,
                                                                       CONCAT11((cStack_267 <
                                                                                (char)bVar31) *
                                                                                bVar31 | (cStack_267
                                                                                         >= (char)
                                                  bVar31) * cStack_267,
                                                  (local_268 < (char)bVar29) * bVar29 |
                                                  (local_268 >= (char)bVar29) * local_268)))))));
            vSaturationCheckMax[0] =
                 CONCAT17((cStack_259 < (char)bVar46) * bVar46 |
                          (cStack_259 >= (char)bVar46) * cStack_259,
                          CONCAT16((cStack_25a < (char)bVar45) * bVar45 |
                                   (cStack_25a >= (char)bVar45) * cStack_25a,
                                   CONCAT15((cStack_25b < (char)bVar44) * bVar44 |
                                            (cStack_25b >= (char)bVar44) * cStack_25b,
                                            CONCAT14((cStack_25c < (char)bVar43) * bVar43 |
                                                     (cStack_25c >= (char)bVar43) * cStack_25c,
                                                     CONCAT13((cStack_25d < (char)bVar42) * bVar42 |
                                                              (cStack_25d >= (char)bVar42) *
                                                              cStack_25d,
                                                              CONCAT12((cStack_25e < (char)bVar41) *
                                                                       bVar41 | (cStack_25e >=
                                                                                (char)bVar41) *
                                                                                cStack_25e,
                                                                       CONCAT11((cStack_25f <
                                                                                (char)bVar40) *
                                                                                bVar40 | (cStack_25f
                                                                                         >= (char)
                                                  bVar40) * cStack_25f,
                                                  (cStack_260 < (char)bVar38) * bVar38 |
                                                  (cStack_260 >= (char)bVar38) * cStack_260)))))));
            alVar48[0] = (ulong)(uint)k;
            alVar48[1]._0_4_ = iVar27;
            alVar48[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,alVar48,s1Len,s2Len,in_R9D,in_stack_fffffffffffff898)
            ;
          }
        }
        vH_1[0] = ptr_02[(iVar1 + -1) % iVar27][1];
        uStack_738 = ptr_02[(iVar1 + -1) % iVar27][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar27) + 0x10U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 8 | uStack_738 >> 0x38;
          uStack_738 = uStack_738 << 8;
        }
        local_5e9 = vH_1[0]._7_1_;
        local_e8 = (char)vSaturationCheckMax[1];
        cStack_e7 = (char)((ulong)vSaturationCheckMax[1] >> 8);
        cStack_e6 = (char)((ulong)vSaturationCheckMax[1] >> 0x10);
        cStack_e5 = (char)((ulong)vSaturationCheckMax[1] >> 0x18);
        cStack_e4 = (char)((ulong)vSaturationCheckMax[1] >> 0x20);
        cStack_e3 = (char)((ulong)vSaturationCheckMax[1] >> 0x28);
        cStack_e2 = (char)((ulong)vSaturationCheckMax[1] >> 0x30);
        cStack_e1 = (char)((ulong)vSaturationCheckMax[1] >> 0x38);
        cStack_e0 = (char)vSaturationCheckMin[0];
        cStack_df = (char)((ulong)vSaturationCheckMin[0] >> 8);
        cStack_de = (char)((ulong)vSaturationCheckMin[0] >> 0x10);
        cStack_dd = (char)((ulong)vSaturationCheckMin[0] >> 0x18);
        cStack_dc = (char)((ulong)vSaturationCheckMin[0] >> 0x20);
        cStack_db = (char)((ulong)vSaturationCheckMin[0] >> 0x28);
        cStack_da = (char)((ulong)vSaturationCheckMin[0] >> 0x30);
        cStack_d9 = (char)((ulong)vSaturationCheckMin[0] >> 0x38);
        local_b8 = (char)vNegInfFront[1];
        cStack_b7 = (char)((ulong)vNegInfFront[1] >> 8);
        cStack_b6 = (char)((ulong)vNegInfFront[1] >> 0x10);
        cStack_b5 = (char)((ulong)vNegInfFront[1] >> 0x18);
        cStack_b4 = (char)((ulong)vNegInfFront[1] >> 0x20);
        cStack_b3 = (char)((ulong)vNegInfFront[1] >> 0x28);
        cStack_b2 = (char)((ulong)vNegInfFront[1] >> 0x30);
        cStack_b1 = (char)((ulong)vNegInfFront[1] >> 0x38);
        cStack_b0 = (char)vSaturationCheckMax[0];
        cStack_af = (char)((ulong)vSaturationCheckMax[0] >> 8);
        cStack_ae = (char)((ulong)vSaturationCheckMax[0] >> 0x10);
        cStack_ad = (char)((ulong)vSaturationCheckMax[0] >> 0x18);
        cStack_ac = (char)((ulong)vSaturationCheckMax[0] >> 0x20);
        cStack_ab = (char)((ulong)vSaturationCheckMax[0] >> 0x28);
        cStack_aa = (char)((ulong)vSaturationCheckMax[0] >> 0x30);
        cStack_a9 = (char)((ulong)vSaturationCheckMax[0] >> 0x38);
        uVar39 = CONCAT17(-(cStack_d9 < (char)bVar25),
                          CONCAT16(-(cStack_da < (char)bVar25),
                                   CONCAT15(-(cStack_db < (char)bVar25),
                                            CONCAT14(-(cStack_dc < (char)bVar25),
                                                     CONCAT13(-(cStack_dd < (char)bVar25),
                                                              CONCAT12(-(cStack_de < (char)bVar25),
                                                                       CONCAT11(-(cStack_df <
                                                                                 (char)bVar25),
                                                                                -(cStack_e0 <
                                                                                 (char)bVar25)))))))
                         ) |
                 CONCAT17(-(cVar26 < cStack_a9),
                          CONCAT16(-(cVar26 < cStack_aa),
                                   CONCAT15(-(cVar26 < cStack_ab),
                                            CONCAT14(-(cVar26 < cStack_ac),
                                                     CONCAT13(-(cVar26 < cStack_ad),
                                                              CONCAT12(-(cVar26 < cStack_ae),
                                                                       CONCAT11(-(cVar26 < cStack_af
                                                                                 ),-(cVar26 < 
                                                  cStack_b0))))))));
        auVar24._8_8_ = uVar39;
        auVar24._0_8_ =
             CONCAT17(-(cStack_e1 < (char)bVar25),
                      CONCAT16(-(cStack_e2 < (char)bVar25),
                               CONCAT15(-(cStack_e3 < (char)bVar25),
                                        CONCAT14(-(cStack_e4 < (char)bVar25),
                                                 CONCAT13(-(cStack_e5 < (char)bVar25),
                                                          CONCAT12(-(cStack_e6 < (char)bVar25),
                                                                   CONCAT11(-(cStack_e7 <
                                                                             (char)bVar25),
                                                                            -(local_e8 <
                                                                             (char)bVar25)))))))) |
             CONCAT17(-(cVar26 < cStack_b1),
                      CONCAT16(-(cVar26 < cStack_b2),
                               CONCAT15(-(cVar26 < cStack_b3),
                                        CONCAT14(-(cVar26 < cStack_b4),
                                                 CONCAT13(-(cVar26 < cStack_b5),
                                                          CONCAT12(-(cVar26 < cStack_b6),
                                                                   CONCAT11(-(cVar26 < cStack_b7),
                                                                            -(cVar26 < local_b8)))))
                                       )));
        if ((((((((((((((((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar39 >> 7 & 1) != 0) || (uVar39 >> 0xf & 1) != 0) || (uVar39 >> 0x17 & 1) != 0)
               || (uVar39 >> 0x1f & 1) != 0) || (uVar39 >> 0x27 & 1) != 0) ||
             (uVar39 >> 0x2f & 1) != 0) || (uVar39 >> 0x37 & 1) != 0) || (long)uVar39 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_5e9 = '\0';
          local_558 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)local_5e9;
        *(int *)((long)&_segNum->s1 + 4) = local_558;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m128i vZero;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi8(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi8(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi8(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi8(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 1);
        vHp = _mm_insert_epi8(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi8(
                    _mm_subs_epi8(vE, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vHp = _mm_adds_epi8(vHp, vW);
            vF = _mm_max_epi8(vF, _mm_adds_epi8(vHt, pvGapper[i]));
            vHt = _mm_max_epi8(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 1);
        vHt = _mm_insert_epi8(vHt, boundary[j+1], 0);
        vF = _mm_max_epi8(vF, _mm_adds_epi8(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 1);
            vFt = _mm_adds_epi8(vFt, vSegLenXgap);
            vF = _mm_max_epi8(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 1);
        vF = _mm_adds_epi8(vF, vNegInfFront);
        vH = _mm_max_epi8(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi8(
                    _mm_subs_epi8(vF, vGapE),
                    _mm_subs_epi8(vH, vGapO));
            vH = _mm_max_epi8(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8 (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 1);
        }
        score = (int8_t) _mm_extract_epi8 (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}